

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_store_aux(REF_NODE ref_node,REF_INT ldim,REF_DBL *aux)

{
  uint uVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_STATUS RVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  ref_node->naux = ldim;
  uVar7 = ldim;
  if (ref_node->aux != (REF_DBL *)0x0) {
    free(ref_node->aux);
    ref_node->aux = (REF_DBL *)0x0;
    uVar7 = ref_node->naux;
  }
  uVar1 = ref_node->max;
  if ((int)(uVar1 * uVar7) < 0) {
    RVar4 = 1;
    pcVar6 = "malloc ref_node->aux of REF_DBL negative";
  }
  else {
    pRVar3 = (REF_DBL *)malloc((ulong)(uVar1 * uVar7) << 3);
    ref_node->aux = pRVar3;
    if (pRVar3 != (REF_DBL *)0x0) {
      if (0 < (int)uVar1) {
        pRVar2 = ref_node->global;
        uVar9 = 0;
        iVar8 = 0;
        uVar5 = 0;
        do {
          if (-1 < pRVar2[uVar5] && 0 < (int)uVar7) {
            memcpy(pRVar3 + uVar9,aux + iVar8,(ulong)uVar7 << 3);
          }
          uVar5 = uVar5 + 1;
          iVar8 = iVar8 + ldim;
          uVar9 = (ulong)((int)uVar9 + uVar7);
        } while (uVar1 != uVar5);
      }
      return 0;
    }
    RVar4 = 2;
    pcVar6 = "malloc ref_node->aux of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa8a,
         "ref_node_store_aux",pcVar6);
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_store_aux(REF_NODE ref_node, REF_INT ldim,
                                      REF_DBL *aux) {
  REF_INT iaux, node;
  ref_node_naux(ref_node) = ldim;
  if (NULL != ref_node->aux) {
    ref_free(ref_node->aux);
    ref_node->aux = NULL;
  }
  ref_malloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
             REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      ref_node_aux(ref_node, iaux, node) = aux[iaux + ldim * node];
    }
  }
  return REF_SUCCESS;
}